

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Process.cpp
# Opt level: O1

int __thiscall Process::open(Process *this,char *__file,int __oflag,...)

{
  String *pSVar1;
  code *pcVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  uint32 uVar6;
  int *piVar7;
  char *pcVar8;
  char **in_RCX;
  char **ppcVar9;
  long lVar10;
  long *extraout_RDX;
  char **ppcVar11;
  char **ppcVar12;
  Process *this_00;
  uint in_R8D;
  String *this_01;
  undefined8 uStack_50;
  undefined8 local_48;
  int stdoutFds [2];
  int stderrFds [2];
  int stdinFds [2];
  
  ppcVar11 = (char **)&local_48;
  if (this->pid != 0) {
    uStack_50 = 0x10a36a;
    piVar7 = __errno_location();
    *piVar7 = 0x16;
    return 0;
  }
  local_48 = 0;
  stdoutFds[0] = 0;
  stdoutFds[1] = 0;
  stderrFds[0] = 0;
  stderrFds[1] = 0;
  ppcVar9 = in_RCX;
  if ((in_R8D & 1) == 0) {
LAB_0010a3a7:
    iVar4 = (int)ppcVar9;
    if ((in_R8D & 2) != 0) {
      uStack_50 = 0x10a3b6;
      iVar5 = pipe(stdoutFds);
      if (iVar5 != 0) goto LAB_0010a3cd;
    }
    if ((in_R8D & 4) != 0) {
      uStack_50 = 0x10a3c9;
      iVar5 = pipe(stderrFds);
      if (iVar5 != 0) goto LAB_0010a3cd;
    }
    if ((__oflag == 0) ||
       (ppcVar9 = (char **)(ulong)(uint)__oflag, in_RCX[(long)__oflag + -1] != (char *)0x0)) {
      iVar4 = __oflag + (uint)(__oflag == 0);
      lVar10 = (long)iVar4;
      lVar3 = -(lVar10 * 8 + 0x17U & 0xfffffffffffffff0);
      ppcVar11 = (char **)((long)stdoutFds + lVar3 + -8);
      ppcVar11[lVar10] = (char *)0x0;
      if (1 < iVar4) {
        *(undefined8 *)((long)&uStack_50 + lVar3) = 0x10a484;
        memcpy((void *)((long)stdoutFds + lVar3),in_RCX + 1,(ulong)(iVar4 - 1) << 3);
        iVar4 = (int)lVar10;
      }
      *(undefined8 *)((long)&uStack_50 + lVar3) = 0x10a48c;
      pcVar8 = String::operator_cast_to_char_((String *)__file);
      *ppcVar11 = pcVar8;
      ppcVar9 = ppcVar11;
      in_RCX = ppcVar11;
    }
    ppcVar11[-1] = (char *)0x10a498;
    uVar6 = vfork();
    if (uVar6 != 0xffffffff) {
      iVar5 = local_48._4_4_;
      if (uVar6 != 0) {
        this->pid = uVar6;
        if (local_48._4_4_ != 0) {
          ppcVar11[-1] = (char *)0x10a56a;
          ::close(iVar5);
        }
        iVar4 = stdoutFds[1];
        if (stdoutFds[1] != 0) {
          ppcVar11[-1] = (char *)0x10a576;
          ::close(iVar4);
        }
        iVar4 = stderrFds[0];
        if (stderrFds[0] != 0) {
          ppcVar11[-1] = (char *)0x10a582;
          ::close(iVar4);
        }
        this->fdStdOutRead = (int)local_48;
        this->fdStdErrRead = stdoutFds[0];
        this->fdStdInWrite = stderrFds[1];
        return (int)CONCAT71((int7)((ulong)__file >> 8),1);
      }
      if (local_48._4_4_ != 0) {
        ppcVar11[-1] = (char *)0x10a4ba;
        dup2(iVar5,1);
        iVar5 = local_48._4_4_;
        ppcVar11[-1] = (char *)0x10a4c2;
        ::close(iVar5);
      }
      iVar5 = stdoutFds[1];
      if (stdoutFds[1] != 0) {
        ppcVar11[-1] = (char *)0x10a4d3;
        dup2(iVar5,2);
        iVar5 = stdoutFds[1];
        ppcVar11[-1] = (char *)0x10a4db;
        ::close(iVar5);
      }
      iVar5 = stderrFds[0];
      if (stderrFds[0] != 0) {
        ppcVar11[-1] = (char *)0x10a4e9;
        dup2(iVar5,0);
        iVar5 = stderrFds[0];
        ppcVar11[-1] = (char *)0x10a4f1;
        ::close(iVar5);
      }
      iVar5 = (int)local_48;
      if ((int)local_48 != 0) {
        ppcVar11[-1] = (char *)0x10a4fd;
        ::close(iVar5);
      }
      iVar5 = stdoutFds[0];
      if (stdoutFds[0] != 0) {
        ppcVar11[-1] = (char *)0x10a509;
        ::close(iVar5);
      }
      iVar5 = stderrFds[1];
      if (stderrFds[1] != 0) {
        ppcVar11[-1] = (char *)0x10a515;
        ::close(iVar5);
      }
      ppcVar11[-1] = (char *)0x10a51d;
      pcVar8 = String::operator_cast_to_char_((String *)__file);
      ppcVar11[-1] = (char *)0x10a528;
      ppcVar12 = in_RCX;
      iVar5 = execvp(pcVar8,in_RCX);
      if (iVar5 != -1) {
        ppcVar11[-1] = (char *)0x10a550;
        iVar4 = Debug::printf("%s:%u: assertion failed: %s\n",
                              "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]dehprox/3rdparty/libnstd/src/Process.cpp"
                              ,0x2a5,"false");
        if (iVar4 == 0) {
          return 0;
        }
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      ppcVar11[-1] = (char *)0x10a5a5;
      this_00 = (Process *)__file;
      open(__file,(int)ppcVar12);
      ppcVar11[-1] = &stack0xfffffffffffffff8;
      ppcVar11[-2] = (char *)in_RCX;
      ppcVar11[-3] = (char *)this;
      ppcVar11[-4] = (char *)(ulong)in_R8D;
      ppcVar11[-5] = (char *)ppcVar9;
      ppcVar11[-6] = __file;
      *(int *)((long)ppcVar11 + -0x5c) = iVar4;
      ppcVar11[-7] = (char *)ppcVar12;
      pcVar8 = (char *)extraout_RDX[2];
      ppcVar11[-0xb] = (char *)0x0;
      ppcVar11[-10] = (char *)0x0;
      ppcVar11[-9] = pcVar8;
      pSVar1 = (String *)*extraout_RDX;
      this_01 = (String *)extraout_RDX[1];
      if (this_01 != pSVar1) {
        do {
          ppcVar11[-0xe] = (char *)0x10a5ed;
          pcVar8 = String::operator_cast_to_char_(this_01);
          ppcVar11[-0xe] = (char *)0x10a609;
          Array<const_char_*>::reserve
                    ((Array<const_char_*> *)(ppcVar11 + -0xb),
                     ((long)ppcVar11[-10] - (long)ppcVar11[-0xb] >> 3) + 1);
          *(char **)ppcVar11[-10] = pcVar8;
          ppcVar11[-10] = ppcVar11[-10] + 8;
          this_01 = (String *)this_01[1]._data.str;
        } while (this_01 != pSVar1);
      }
      lVar3 = extraout_RDX[2];
      ppcVar11[-0xe] = (char *)0x10a63c;
      iVar4 = open(this_00,ppcVar11[-7],(int)lVar3,ppcVar11[-0xb],
                   (ulong)*(uint *)((long)ppcVar11 + -0x5c));
      if (ppcVar11[-0xb] != (char *)0x0) {
        ppcVar11[-0xe] = (char *)0x10a64d;
        operator_delete__(ppcVar11[-0xb]);
      }
      return iVar4;
    }
  }
  else {
    uStack_50 = 0x10a3a3;
    iVar4 = pipe((int *)&local_48);
    if (iVar4 == 0) goto LAB_0010a3a7;
LAB_0010a3cd:
    uStack_50 = 0x10a3d2;
    piVar7 = __errno_location();
    iVar4 = *piVar7;
    if ((int)local_48 != 0) {
      uStack_50 = 0x10a3e4;
      ::close((int)local_48);
      uStack_50 = 0x10a3ec;
      ::close(local_48._4_4_);
    }
    if (stdoutFds[0] != 0) {
      uStack_50 = 0x10a3f8;
      ::close(stdoutFds[0]);
      uStack_50 = 0x10a400;
      ::close(stdoutFds[1]);
    }
    if (stderrFds[0] != 0) {
      uStack_50 = 0x10a40c;
      ::close(stderrFds[0]);
      uStack_50 = 0x10a414;
      ::close(stderrFds[1]);
    }
    *piVar7 = iVar4;
  }
  return 0;
}

Assistant:

bool Process::open(const String& executable, int argc, char* const argv[], uint streams)
{
#ifdef _WIN32
  return open(Private::getCommandLine(executable, argc, argv), streams);
#else
  if (pid)
  {
    errno = EINVAL;
    return false;
  }

  // create pipes
  int stdoutFds[2] = {};
  int stderrFds[2] = {};
  int stdinFds[2] = {};
  if (streams & stdoutStream)
  {
    if (pipe(stdoutFds) != 0)
      goto error;
  }
  if (streams & stderrStream)
  {
    if (pipe(stderrFds) != 0)
      goto error;
  }
  if (streams & stdinStream)
  {
    if (pipe(stdinFds) != 0)
      goto error;
  }

  // prepare argv of child
  const char** args;
  if (argc && !argv[argc - 1])
    args = (const char**)argv;
  else
  {
    if (!argc)
      ++argc;
    args = (const char**)alloca(sizeof(const char*) * (argc + 1));
    args[argc] = 0;
    for (int i = 1; i < argc; ++i)
      args[i] = argv[i];
    args[0] = executable;
  }

  // start process
  {
    int r = vfork();
    if (r == -1)
      return false;
    else if (r != 0) // parent
    {
      pid = r;

      if (stdoutFds[1])
        ::close(stdoutFds[1]);
      if (stderrFds[1])
        ::close(stderrFds[1]);
      if (stdinFds[0])
        ::close(stdinFds[0]);

      fdStdOutRead = stdoutFds[0];
      fdStdErrRead = stderrFds[0];
      fdStdInWrite = stdinFds[1];

      return true;
    }
    else // child
    {
      if (stdoutFds[1])
      {
        dup2(stdoutFds[1], STDOUT_FILENO);
        ::close(stdoutFds[1]);
      }
      if (stderrFds[1])
      {
        dup2(stderrFds[1], STDERR_FILENO);
        ::close(stderrFds[1]);
      }
      if (stdinFds[0])
      {
        dup2(stdinFds[0], STDIN_FILENO);
        ::close(stdinFds[0]);
      }

      if (stdoutFds[0])
        ::close(stdoutFds[0]);
      if (stderrFds[0])
        ::close(stderrFds[0]);
      if (stdinFds[1])
        ::close(stdinFds[1]);

      if (execvp(executable, (char* const*)args) == -1)
      {
        fprintf(stderr, "%s: %s\n", (const char*)executable, strerror(errno));
        _exit(EXIT_FAILURE);
      }
      ASSERT(false); // unreachable
      return false;
    }
  }
error:
  int err = errno;
  if (stdoutFds[0])
  {
    ::close(stdoutFds[0]);
    ::close(stdoutFds[1]);
  }
  if (stderrFds[0])
  {
    ::close(stderrFds[0]);
    ::close(stderrFds[1]);
  }
  if (stdinFds[0])
  {
    ::close(stdinFds[0]);
    ::close(stdinFds[1]);
  }
  errno = err;
  return false;
#endif
}